

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

iterator __thiscall llvm::yaml::Scanner::skip_nb_char(Scanner *this,iterator Position)

{
  char cVar1;
  UTF8Decoded UVar2;
  iterator pcVar3;
  uint uVar4;
  iterator pcVar5;
  
  pcVar5 = Position;
  if (this->End != Position) {
    cVar1 = *Position;
    if (cVar1 == '\t' || 0xa0 < (byte)(cVar1 + 0x81U)) {
      pcVar5 = Position + 1;
    }
    else if (cVar1 < '\0') {
      UVar2 = decodeUTF8(this,Position);
      uVar4 = UVar2.first;
      if ((((uVar4 != 0xfeff && (ulong)UVar2 >> 0x20 != 0) &&
           (pcVar3 = Position + ((ulong)UVar2 >> 0x20), pcVar5 = pcVar3,
           uVar4 - 0x110000 < 0xfff00000)) && (uVar4 - 0xfffe < 0xffffe002)) &&
         ((uVar4 != 0x85 && (pcVar5 = Position, 0xffff289f < uVar4 - 0xd800)))) {
        pcVar5 = pcVar3;
      }
    }
  }
  return pcVar5;
}

Assistant:

StringRef::iterator Scanner::skip_nb_char(StringRef::iterator Position) {
  if (Position == End)
    return Position;
  // Check 7 bit c-printable - b-char.
  if (   *Position == 0x09
      || (*Position >= 0x20 && *Position <= 0x7E))
    return Position + 1;

  // Check for valid UTF-8.
  if (uint8_t(*Position) & 0x80) {
    UTF8Decoded u8d = decodeUTF8(Position);
    if (   u8d.second != 0
        && u8d.first != 0xFEFF
        && ( u8d.first == 0x85
          || ( u8d.first >= 0xA0
            && u8d.first <= 0xD7FF)
          || ( u8d.first >= 0xE000
            && u8d.first <= 0xFFFD)
          || ( u8d.first >= 0x10000
            && u8d.first <= 0x10FFFF)))
      return Position + u8d.second;
  }
  return Position;
}